

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O3

void __thiscall soplex::SoPlexBase<double>::_optimize(SoPlexBase<double> *this,bool *interrupt)

{
  undefined1 *puVar1;
  SPxScaler<double> *pSVar2;
  Settings *pSVar3;
  SLinSolver<double> *pSVar4;
  Statistics *pSVar5;
  bool bVar6;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double dVar7;
  
  puVar1 = &(this->_solReal).field_0x98;
  *puVar1 = *puVar1 & 0xf0;
  this->_optimizeCalls = this->_optimizeCalls + 1;
  (*this->_statistics->solvingTime->_vptr_Timer[3])();
  if (this->_currentSettings->_boolParamValues[9] == true) {
    pSVar2 = this->_scaler;
    bVar6 = this->_realLP->_isScaled;
    if (pSVar2 == (SPxScaler<double> *)0x0) {
      if (bVar6 != false) {
        SPxSolverBase<double>::unscaleLPandReloadBasis(&this->_solver);
        this->_isRealLPScaled = false;
        this->_unscaleCalls = this->_unscaleCalls + 1;
      }
    }
    else if ((bVar6 == false) &&
            ((this->_optimizeCalls < 0xb ||
             ((double)this->_unscaleCalls <= (double)this->_optimizeCalls * 0.1)))) {
      (*pSVar2->_vptr_SPxScaler[0xd])(pSVar2,this->_realLP,1);
      this->_isRealLPScaled = this->_realLP->_isScaled;
      SPxBasisBase<double>::invalidate(&(this->_solver).super_SPxBasisBase<double>);
      (*(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(&this->_solver);
      (*(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])(&this->_solver);
    }
  }
  this->_lastSolveMode = 0;
  if (this->_hasBasis == false) {
    pSVar3 = this->_currentSettings;
    dVar7 = pSVar3->_realParamValues[6];
    if ((pSVar3->_realParamValues[8] == -dVar7) &&
       (!NAN(pSVar3->_realParamValues[8]) && !NAN(-dVar7))) {
      bVar6 = true;
      if ((pSVar3->_realParamValues[9] == dVar7) &&
         (!NAN(pSVar3->_realParamValues[9]) && !NAN(dVar7))) goto LAB_00314837;
    }
  }
  bVar6 = false;
LAB_00314837:
  _preprocessAndSolveReal(this,bVar6,interrupt);
  ::soplex::infinity::__tls_init();
  if ((this->_solver).super_SPxBasisBase<double>.factorized == true) {
    pSVar4 = (this->_solver).super_SPxBasisBase<double>.factor;
    (*pSVar4->_vptr_SLinSolver[7])(pSVar4,0);
    dVar7 = extraout_XMM0_Qa;
  }
  else {
    dVar7 = *(double *)(in_FS_OFFSET + -8);
  }
  pSVar5 = this->_statistics;
  pSVar5->finalBasisCondition = dVar7;
  (*pSVar5->solvingTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SoPlexBase<R>::_optimize(volatile bool* interrupt)
{
   assert(_realLP != nullptr);
   assert(_realLP == &_solver);

   _solReal.invalidate();
   ++_optimizeCalls;

   // start timing
   _statistics->solvingTime->start();

   if(boolParam(SoPlexBase<R>::PERSISTENTSCALING))
   {
      // scale original problem; overwriting _realLP
      if(_scaler && !_realLP->isScaled() && _reapplyPersistentScaling())
      {
#ifdef SOPLEX_DEBUG
         SPxLPBase<R>* origLP = 0;
         spx_alloc(origLP);
         origLP = new(origLP) SPxLPBase<R>(*_realLP);
#endif
         _scaler->scale(*_realLP, true);
         _isRealLPScaled = _realLP->isScaled(); // a scaler might decide not to apply scaling
         _solver.invalidateBasis();
#ifdef SOPLEX_DEBUG
         _checkScaling(origLP);
#endif
      }
      // unscale previously scaled problem, overwriting _realLP
      else if(!_scaler && _realLP->isScaled())
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }
   }

   // remember that last solve was in floating-point
   _lastSolveMode = SOLVEMODE_REAL;

   // solve and store solution; if we have a starting basis, do not apply preprocessing; if we are solving from
   // scratch, apply preprocessing according to parameter settings
   if(!_hasBasis && realParam(SoPlexBase<R>::OBJLIMIT_LOWER) == -realParam(SoPlexBase<R>::INFTY)
         && realParam(SoPlexBase<R>::OBJLIMIT_UPPER) == realParam(SoPlexBase<R>::INFTY))
      _preprocessAndSolveReal(true, interrupt);
   else
      _preprocessAndSolveReal(false, interrupt);

   _statistics->finalBasisCondition = _solver.getBasisMetric(0);

   // stop timing
   _statistics->solvingTime->stop();
}